

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O2

String * __thiscall
axl::zip::ZipReader::getFileName(String *__return_storage_ptr__,ZipReader *this,size_t index)

{
  mz_uint filename_buf_size;
  C *pFilename;
  
  filename_buf_size = mz_zip_reader_get_filename(this->m_zip,(mz_uint)index,(char *)0x0,0);
  (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
       (C *)0x0;
  (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr =
       (BufHdr *)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
           m_hdr + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
           m_length + 1) = 0;
  pFilename = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
                        (__return_storage_ptr__,(ulong)filename_buf_size,false);
  mz_zip_reader_get_filename(this->m_zip,(mz_uint)index,pFilename,filename_buf_size);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::chop(__return_storage_ptr__,1);
  return __return_storage_ptr__;
}

Assistant:

sl::String
ZipReader::getFileName(size_t index) const {
	ASSERT(isOpen());
	size_t size = mz_zip_reader_get_filename(m_zip, index, NULL, 0);

	sl::String fileName;
	char* p = fileName.createBuffer(size);
	mz_zip_reader_get_filename(m_zip, index, p, size);
	fileName.chop(1);
	return fileName;
}